

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeExtractSampleLists.cpp
# Opt level: O2

void writeSampleList(char *casePath,int listNdx,SampleList *sampleList)

{
  Item *pIVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  pointer ppIVar4;
  runtime_error *this;
  int valNdx;
  long lVar5;
  int sampleNdx;
  int ndx;
  long lVar6;
  allocator<char> local_2bd;
  int listNdx_local;
  SampleList *local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  string filename;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ofstream out;
  int aiStack_210 [120];
  
  listNdx_local = listNdx;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,casePath,&local_2bd);
  std::operator+(&local_2b0,&local_250,".");
  de::toString<int>(&local_270,&listNdx_local);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                 &local_2b0,&local_270);
  std::operator+(&filename,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out
                 ,".csv");
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_250);
  std::ofstream::ofstream(&out,filename._M_dataplus._M_p,_S_bin);
  if (*(int *)((long)aiStack_210 + *(long *)(_out + -0x18)) == 0) {
    for (lVar6 = 0;
        ppIVar4 = (sampleList->sampleInfo).valueInfos.m_items.
                  super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
        lVar6 < (int)((ulong)((long)(sampleList->sampleInfo).valueInfos.m_items.
                                    super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar4) >> 3
                     ); lVar6 = lVar6 + 1) {
      if (lVar6 != 0) {
        std::operator<<((ostream *)&out,",");
        ppIVar4 = (sampleList->sampleInfo).valueInfos.m_items.
                  super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      std::operator<<((ostream *)&out,(string *)(ppIVar4[lVar6] + 1));
    }
    std::operator<<((ostream *)&out,"\n");
    local_2b8 = sampleList;
    for (lVar6 = 0;
        ppIVar4 = (local_2b8->samples).m_items.
                  super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
        lVar6 < (int)((ulong)((long)(local_2b8->samples).m_items.
                                    super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar4) >> 3
                     ); lVar6 = lVar6 + 1) {
      pIVar1 = ppIVar4[lVar6];
      for (lVar5 = 0; pp_Var2 = pIVar1[1]._vptr_Item,
          lVar5 < (int)((ulong)(*(long *)&pIVar1[1].m_type - (long)pp_Var2) >> 3); lVar5 = lVar5 + 1
          ) {
        p_Var3 = pp_Var2[lVar5];
        if (lVar5 != 0) {
          std::operator<<((ostream *)&out,",");
        }
        xe::ri::operator<<((ostream *)&out,(NumericValue *)(p_Var3 + 0x10));
      }
      std::operator<<((ostream *)&out,"\n");
    }
    std::ofstream::~ofstream(&out);
    std::__cxx11::string::~string((string *)&filename);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_2b0,"Failed to open ",&filename);
  std::runtime_error::runtime_error(this,(string *)&local_2b0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void writeSampleList (const char* casePath, int listNdx, const xe::ri::SampleList& sampleList)
{
	const string	filename	= string(casePath) + "." + de::toString(listNdx) + ".csv";
	std::ofstream	out			(filename.c_str(), std::ios_base::binary);

	if (!out.good())
		throw std::runtime_error("Failed to open " + filename);

	// Header
	for (int ndx = 0; ndx < sampleList.sampleInfo.valueInfos.getNumItems(); ndx++)
	{
		if (ndx != 0)
			out << ",";
		out << static_cast<const xe::ri::ValueInfo&>(sampleList.sampleInfo.valueInfos.getItem(ndx)).name;
	}
	out << "\n";

	// Samples
	for (int sampleNdx = 0; sampleNdx < sampleList.samples.getNumItems(); sampleNdx++)
	{
		const xe::ri::Sample&	sample	= static_cast<const xe::ri::Sample&>(sampleList.samples.getItem(sampleNdx));

		for (int valNdx = 0; valNdx < sample.values.getNumItems(); valNdx++)
		{
			const xe::ri::SampleValue&	value	= static_cast<const xe::ri::SampleValue&>(sample.values.getItem(valNdx));

			if (valNdx != 0)
				out << ",";

			out << value.value;
		}
		out << "\n";
	}
}